

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::FConfigFile(FConfigFile *this,char *pathname)

{
  char *pathname_local;
  FConfigFile *this_local;
  
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_009f1ec0;
  FString::FString(&this->PathName);
  this->CurrentSection = (FConfigSection *)0x0;
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  this->CurrentEntry = (FConfigEntry *)0x0;
  ChangePathName(this,pathname);
  LoadConfigFile(this);
  this->OkayToWrite = true;
  this->FileExisted = true;
  return;
}

Assistant:

FConfigFile::FConfigFile (const char *pathname)
{
	Sections = CurrentSection = NULL;
	LastSectionPtr = &Sections;
	CurrentEntry = NULL;
	ChangePathName (pathname);
	LoadConfigFile ();
	OkayToWrite = true;
	FileExisted = true;
}